

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkedTree.h
# Opt level: O0

ReferenceType __thiscall
cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*(iterator *this)

{
  ulong uVar1;
  size_type sVar2;
  size_type sVar3;
  SnapshotDataType *pSVar4;
  iterator *this_local;
  
  if (this->Tree == (cmLinkedTree<cmState::SnapshotDataType> *)0x0) {
    __assert_fail("this->Tree",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x65,
                  "ReferenceType cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*() [T = cmState::SnapshotDataType]"
                 );
  }
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->Tree->UpPositions)
  ;
  sVar3 = std::vector<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>::size
                    (&this->Tree->Data);
  if (sVar2 != sVar3) {
    __assert_fail("this->Tree->UpPositions.size() == this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x66,
                  "ReferenceType cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*() [T = cmState::SnapshotDataType]"
                 );
  }
  uVar1 = this->Position;
  sVar2 = std::vector<cmState::SnapshotDataType,_std::allocator<cmState::SnapshotDataType>_>::size
                    (&this->Tree->Data);
  if (sVar2 < uVar1) {
    __assert_fail("this->Position <= this->Tree->Data.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                  ,0x67,
                  "ReferenceType cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*() [T = cmState::SnapshotDataType]"
                 );
  }
  if (this->Position != 0) {
    pSVar4 = GetReference(this->Tree,this->Position - 1);
    return pSVar4;
  }
  __assert_fail("this->Position > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Source/cmLinkedTree.h"
                ,0x68,
                "ReferenceType cmLinkedTree<cmState::SnapshotDataType>::iterator::operator*() [T = cmState::SnapshotDataType]"
               );
}

Assistant:

ReferenceType operator*()
    {
      assert(this->Tree);
      assert(this->Tree->UpPositions.size() == this->Tree->Data.size());
      assert(this->Position <= this->Tree->Data.size());
      assert(this->Position > 0);
      return this->Tree->GetReference(this->Position - 1);
    }